

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadControllerJoints(ColladaParser *this,Controller *pController)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  undefined4 extraout_var_01;
  allocator<char> local_399;
  string local_398;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_378 [376];
  string local_200;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1d0 [376];
  string local_58;
  char *local_38;
  char *attrSource;
  char *pcStack_28;
  int indexSource;
  char *attrSemantic;
  Controller *pCStack_18;
  int indexSemantic;
  Controller *pController_local;
  ColladaParser *this_local;
  
  pCStack_18 = pController;
  pController_local = (Controller *)this;
  while( true ) {
    while( true ) {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 == 1) break;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 == 2) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"joints");
          if (iVar3 == 0) {
            return;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,"Expected end of <joints> element.",&local_399);
          ThrowException(this,&local_398);
        }
      }
      bVar1 = IsElement(this,"input");
      if (bVar1) break;
      SkipElement(this);
    }
    attrSemantic._4_4_ = GetAttribute(this,"semantic");
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)attrSemantic._4_4_);
    pcStack_28 = (char *)CONCAT44(extraout_var,iVar3);
    attrSource._4_4_ = GetAttribute(this,"source");
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)attrSource._4_4_);
    local_38 = (char *)CONCAT44(extraout_var_00,iVar3);
    if (*local_38 != '#') break;
    local_38 = local_38 + 1;
    iVar3 = strcmp(pcStack_28,"JOINT");
    if (iVar3 == 0) {
      std::__cxx11::string::operator=((string *)&pCStack_18->mJointNameSource,local_38);
    }
    else {
      iVar3 = strcmp(pcStack_28,"INV_BIND_MATRIX");
      if (iVar3 != 0) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_378);
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(local_378,(char (*) [19])"Unknown semantic \"");
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar4,&stack0xffffffffffffffd8);
        pbVar5 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar4,(char (*) [35])"\" in <joints> data <input> element");
        Formatter::basic_formatter::operator_cast_to_string(&local_200,pbVar5);
        ThrowException(this,&local_200);
      }
      std::__cxx11::string::operator=((string *)&pCStack_18->mJointOffsetMatrixSource,local_38);
    }
    uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
    if ((uVar2 & 1) == 0) {
      SkipElement(this);
    }
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_1d0,(char (*) [28])"Unsupported URL format in \"");
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,&local_38);
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,(char (*) [55])
                             "\" in source attribute of <joints> data <input> element");
  Formatter::basic_formatter::operator_cast_to_string(&local_58,pbVar5);
  ThrowException(this,&local_58);
}

Assistant:

void ColladaParser::ReadControllerJoints(Collada::Controller& pController)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for joint data. Two possible semantics: "JOINT" and "INV_BIND_MATRIX"
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <joints> data <input> element");
                attrSource++;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mJointNameSource = attrSource;
                else if (strcmp(attrSemantic, "INV_BIND_MATRIX") == 0)
                    pController.mJointOffsetMatrixSource = attrSource;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <joints> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "joints") != 0)
                ThrowException("Expected end of <joints> element.");

            break;
        }
    }
}